

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O2

int Pm_HasHostError(PortMidiStream *stream)

{
  PmInternal *midi;
  
  if (pm_hosterror == 0) {
    if (stream == (PortMidiStream *)0x0) {
      return 0;
    }
    pm_hosterror = (**(code **)(*(long *)((long)stream + 0x50) + 0x58))(stream);
    if (pm_hosterror == 0) {
      return 0;
    }
    (**(code **)(*(long *)((long)stream + 0x50) + 0x60))(stream,pm_hosterror_text,0x100);
  }
  return 1;
}

Assistant:

PMEXPORT int Pm_HasHostError(PortMidiStream * stream) {
    if (pm_hosterror) return TRUE;
    if (stream) {
        PmInternal * midi = (PmInternal *) stream;
        pm_hosterror = (*midi->dictionary->has_host_error)(midi);
        if (pm_hosterror) {
            midi->dictionary->host_error(midi, pm_hosterror_text, 
                                         PM_HOST_ERROR_MSG_LEN);
            /* now error message is global */
            return TRUE;
        }
    }
    return FALSE;
}